

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O3

void __thiscall
burst::k_ary_search_set<long,std::less<void>>::
initialize<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
          (k_ary_search_set<long,std::less<void>> *this,
          iterator_range<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>_>
          *range)

{
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> __first;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> __last;
  long lVar1;
  __normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_> _Var2;
  ulong uVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  const_iterator __cbeg;
  value_container_type buffer;
  long *local_40;
  long *local_38;
  long local_30;
  iterator_range<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
  local_28;
  
  __first._M_current =
       (range->
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
       ).
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin._M_current;
  __last._M_current =
       (range->
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
       ).
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_End._M_current;
  _Var2._M_current = __first._M_current;
  if (__first._M_current == __last._M_current) {
LAB_0010c72b:
    initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>>>
              (this,range);
    return;
  }
  do {
    plVar5 = _Var2._M_current + 1;
    if (plVar5 == __last._M_current) goto LAB_0010c72b;
    lVar6 = *_Var2._M_current;
    _Var2._M_current = plVar5;
  } while (lVar6 < *plVar5);
  std::vector<long,std::allocator<long>>::
  vector<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,void>
            ((vector<long,std::allocator<long>> *)&local_40,__first,__last,
             (allocator_type *)&local_28);
  plVar4 = local_38;
  plVar5 = local_40;
  if (local_40 != local_38) {
    uVar3 = (long)local_38 - (long)local_40 >> 3;
    lVar6 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
              (local_40,local_38,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<void>>>
              (plVar5,plVar4);
  }
  if (local_40 != local_38) {
    plVar5 = local_40 + 1;
    do {
      plVar4 = plVar5;
      if (plVar4 == local_38) goto LAB_0010c750;
      lVar6 = plVar4[-1];
      plVar5 = plVar4 + 1;
    } while (lVar6 < *plVar4);
    plVar4 = plVar4 + -1;
    for (; plVar5 != local_38; plVar5 = plVar5 + 1) {
      lVar1 = *plVar5;
      if (lVar6 < lVar1) {
        plVar4[1] = lVar1;
        plVar4 = plVar4 + 1;
        lVar6 = lVar1;
      }
    }
    if (plVar4 + 1 != local_38) {
      local_38 = plVar4 + 1;
    }
  }
LAB_0010c750:
  local_28.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_40;
  local_28.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_38;
  initialize_trusted<boost::iterator_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>>
            (this,&local_28);
  if (local_40 != (long *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  return;
}

Assistant:

void initialize (const RandomAccessRange & range)
        {
            const auto is_sorted_and_unique =
                std::adjacent_find(range.begin(), range.end(), burst::not_fn(m_compare)) == range.end();
            if (is_sorted_and_unique)
            {
                initialize_trusted(range);
            }
            else
            {
                value_container_type buffer(range.begin(), range.end());
                std::sort(buffer.begin(), buffer.end(), m_compare);
                buffer.erase
                (
                    std::unique(buffer.begin(), buffer.end(), burst::not_fn(m_compare)),
                    buffer.end()
                );

                initialize_trusted(boost::make_iterator_range(buffer));
            }
        }